

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlock.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  FILE *__stream;
  char *__format;
  void *data;
  long lVar4;
  
  iVar1 = SDL_Init(0);
  __stream = _stderr;
  if (iVar1 < 0) {
    uVar2 = SDL_GetError();
    __format = "%s\n";
  }
  else {
    atexit(SDL_Quit_Wrapper);
    mutex = (SDL_mutex *)SDL_CreateMutex();
    __stream = _stderr;
    if (mutex != (SDL_mutex *)0x0) {
      mainthread = SDL_ThreadID();
      printf("Main thread: %u\n",(ulong)mainthread);
      atexit(printid);
      for (lVar4 = 0; lVar4 != 0x30; lVar4 = lVar4 + 8) {
        lVar3 = SDL_CreateThread(Run,0);
        *(long *)((long)threads + lVar4) = lVar3;
        if (lVar3 == 0) {
          fwrite("Couldn\'t create thread!\n",0x18,1,_stderr);
        }
      }
      data = (void *)0x2;
      signal(2,terminate);
      Run(data);
      iVar1 = SDL_Quit();
      return iVar1;
    }
    uVar2 = SDL_GetError();
    __format = "Couldn\'t create mutex: %s\n";
  }
  fprintf(__stream,__format,uVar2);
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
	int i;
	int maxproc = 6;

	/* Load the SDL library */
	if ( SDL_Init(0) < 0 ) {
		fprintf(stderr, "%s\n", SDL_GetError());
		exit(1);
	}
	atexit(SDL_Quit_Wrapper);

	if ( (mutex=SDL_CreateMutex()) == NULL ) {
		fprintf(stderr, "Couldn't create mutex: %s\n", SDL_GetError());
		exit(1);
	}

	mainthread = SDL_ThreadID();
	printf("Main thread: %u\n", mainthread);
	atexit(printid);
	for ( i=0; i<maxproc; ++i ) {
		if ( (threads[i]=SDL_CreateThread(Run, NULL)) == NULL )
			fprintf(stderr, "Couldn't create thread!\n");
	}
	signal(SIGINT, terminate);
	Run(NULL);

	return(0);	/* Never reached */
}